

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

int __thiscall
fmt::v6::basic_string_view<wchar_t>::compare
          (basic_string_view<wchar_t> *this,basic_string_view<wchar_t> other)

{
  uint uVar1;
  ulong uVar2;
  ulong __n;
  
  uVar2 = other.size_;
  __n = this->size_;
  if (uVar2 <= this->size_) {
    __n = uVar2;
  }
  uVar1 = std::char_traits<wchar_t>::compare(this->data_,other.data_,__n);
  if ((uVar1 == 0) && (uVar1 = -(uint)(this->size_ < uVar2) | 1, this->size_ == uVar2)) {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

int compare(basic_string_view other) const {
    size_t str_size = size_ < other.size_ ? size_ : other.size_;
    int result = std::char_traits<Char>::compare(data_, other.data_, str_size);
    if (result == 0)
      result = size_ == other.size_ ? 0 : (size_ < other.size_ ? -1 : 1);
    return result;
  }